

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
* __thiscall
Centaurus::ATNPrinter<wchar_t>::print_atn_abi_cxx11_
          (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *__return_storage_ptr__,ATNPrinter<wchar_t> *this,wostream *os,int index,Identifier *key)

{
  bool bVar1;
  int iVar2;
  wostream *pwVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference this_00;
  reference pvVar8;
  bool local_312;
  wstring local_2b0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_290;
  undefined1 local_270 [8];
  wstring exit_node;
  wstring entry_node;
  wstring *entry;
  ATNTransition<wchar_t> *t;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  *__range3;
  wstring *exit;
  ATNNode<wchar_t> *node_1;
  undefined1 local_1f0 [4];
  uint i_1;
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_1b0;
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_170;
  __normal_iterator<Centaurus::Identifier_*,_std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>_>
  local_130;
  Identifier *local_128;
  __normal_iterator<Centaurus::Identifier_*,_std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>_>
  local_120;
  __normal_iterator<Centaurus::Identifier_*,_std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>_>
  local_118;
  wstring local_110;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  undefined1 local_d0 [8];
  wstring node_name;
  ATNNode<wchar_t> *node;
  uint i;
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  entry_exit_nodes;
  ATNMachine<wchar_t> *atn;
  wstring local_70;
  undefined1 local_50 [8];
  wstring prefix;
  Identifier *key_local;
  int index_local;
  wostream *os_local;
  ATNPrinter<wchar_t> *this_local;
  
  iVar2 = this->m_counter;
  this->m_counter = iVar2 + 1;
  prefix.field_2._8_8_ = key;
  std::__cxx11::to_wstring(&local_70,iVar2);
  Identifier::operator+((wstring *)local_50,key,&local_70);
  std::__cxx11::wstring::~wstring((wstring *)&local_70);
  pwVar3 = std::operator<<(os,L"subgraph cluster_");
  pwVar3 = std::operator<<(pwVar3,(wstring *)local_50);
  pwVar3 = std::operator<<(pwVar3,L" {");
  std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
  entry_exit_nodes.
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
                ::at(this->m_networks,(key_type *)prefix.field_2._8_8_);
  sVar4 = std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
          size((vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_> *
               )&((entry_exit_nodes.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first)._M_string_length);
  std::
  allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)((long)&node + 7));
  std::
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
            *)&i,sVar4,
           (allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)((long)&node + 7));
  std::
  allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)((long)&node + 7));
  for (node._0_4_ = 0; uVar5 = (ulong)(uint)node,
      sVar4 = std::
              vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
              size((vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                    *)&((entry_exit_nodes.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                       _M_string_length), uVar5 < sVar4; node._0_4_ = (uint)node + 1) {
    node_name.field_2._8_8_ =
         std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
         operator[]((vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                     *)&((entry_exit_nodes.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                        _M_string_length,(ulong)(uint)node);
    std::operator+(&local_f0,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   local_50,L"_N");
    std::__cxx11::to_wstring(&local_110,(uint)node);
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   local_d0,&local_f0,&local_110);
    std::__cxx11::wstring::~wstring((wstring *)&local_110);
    std::__cxx11::wstring::~wstring((wstring *)&local_f0);
    bVar1 = ATNNode<wchar_t>::is_nonterminal((ATNNode<wchar_t> *)node_name.field_2._8_8_);
    if (bVar1) {
      sVar4 = std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::size
                        (&this->m_stack);
      local_312 = false;
      if (sVar4 < (ulong)(long)this->m_maxdepth) {
        local_120._M_current =
             (Identifier *)
             std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::begin
                       (&this->m_stack);
        local_128 = (Identifier *)
                    std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::end
                              (&this->m_stack);
        local_118 = std::
                    find<__gnu_cxx::__normal_iterator<Centaurus::Identifier*,std::vector<Centaurus::Identifier,std::allocator<Centaurus::Identifier>>>,Centaurus::Identifier>
                              (local_120,
                               (__normal_iterator<Centaurus::Identifier_*,_std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>_>
                                )local_128,(Identifier *)(node_name.field_2._8_8_ + 0x28));
        local_130._M_current =
             (Identifier *)
             std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::end
                       (&this->m_stack);
        local_312 = __gnu_cxx::operator==(&local_118,&local_130);
      }
      if (local_312 == false) {
        ATNNode<wchar_t>::get_entry_exit_wide
                  (&local_1b0,(ATNNode<wchar_t> *)node_name.field_2._8_8_,(wstring *)local_d0);
        pvVar6 = std::
                 vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                               *)&i,(ulong)(uint)node);
        std::
        pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::operator=(pvVar6,&local_1b0);
        std::
        pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::~pair(&local_1b0);
        ATNNode<wchar_t>::print
                  ((ATNNode<wchar_t> *)node_name.field_2._8_8_,os,(uint)node,(wstring *)local_d0);
      }
      else {
        std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::push_back
                  (&this->m_stack,(value_type *)(node_name.field_2._8_8_ + 0x28));
        print_atn_abi_cxx11_
                  (&local_170,this,os,(uint)node,(Identifier *)(node_name.field_2._8_8_ + 0x28));
        pvVar6 = std::
                 vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                               *)&i,(ulong)(uint)node);
        std::
        pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::operator=(pvVar6,&local_170);
        std::
        pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::~pair(&local_170);
        std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::pop_back
                  (&this->m_stack);
      }
    }
    else {
      ATNNode<wchar_t>::get_entry_exit_wide
                ((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                  *)local_1f0,(ATNNode<wchar_t> *)node_name.field_2._8_8_,(wstring *)local_d0);
      pvVar6 = std::
               vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                             *)&i,(ulong)(uint)node);
      std::
      pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::operator=(pvVar6,(type)local_1f0);
      std::
      pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::~pair((type)local_1f0);
      ATNNode<wchar_t>::print
                ((ATNNode<wchar_t> *)node_name.field_2._8_8_,os,(uint)node,(wstring *)local_d0);
    }
    std::__cxx11::wstring::~wstring((wstring *)local_d0);
  }
  for (node_1._4_4_ = 0;
      sVar4 = std::
              vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
              size((vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                    *)&((entry_exit_nodes.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                       _M_string_length), node_1._4_4_ < sVar4; node_1._4_4_ = node_1._4_4_ + 1) {
    pvVar7 = std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
             ::operator[]((vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                           *)&((entry_exit_nodes.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                              _M_string_length,(ulong)node_1._4_4_);
    pvVar6 = std::
             vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                           *)&i,(ulong)node_1._4_4_);
    __end0 = std::
             vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
             ::begin(&pvVar7->m_transitions);
    t = (ATNTransition<wchar_t> *)
        std::
        vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
        ::end(&pvVar7->m_transitions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
                                       *)&t), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
                ::operator*(&__end0);
      iVar2 = ATNTransition<wchar_t>::dest(this_00);
      pvVar8 = std::
               vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                             *)&i,(long)iVar2);
      pwVar3 = std::operator<<(os,(wstring *)&pvVar6->second);
      pwVar3 = std::operator<<(pwVar3,L" -> ");
      pwVar3 = std::operator<<(pwVar3,(wstring *)pvVar8);
      std::operator<<(pwVar3,L" [ label=\"");
      Centaurus::operator<<(os,this_00);
      pwVar3 = std::operator<<(os,L"\" ];");
      std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
      __gnu_cxx::
      __normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
      ::operator++(&__end0);
    }
  }
  pwVar3 = std::operator<<(os,L"label = \"[");
  pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,index);
  pwVar3 = std::operator<<(pwVar3,L"]");
  pwVar3 = Centaurus::operator<<(pwVar3,(Identifier *)prefix.field_2._8_8_);
  pwVar3 = std::operator<<(pwVar3,L"\";");
  std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar3 = std::operator<<(os,L"}");
  std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
  std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 ((long)&exit_node.field_2 + 8),
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_50,L"_N0");
  std::operator+(&local_290,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_50,L"_N");
  sVar4 = std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
          size((vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_> *
               )&((entry_exit_nodes.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first)._M_string_length);
  std::__cxx11::to_wstring(&local_2b0,sVar4 - 1);
  std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_270,&local_290,&local_2b0);
  std::__cxx11::wstring::~wstring((wstring *)&local_2b0);
  std::__cxx11::wstring::~wstring((wstring *)&local_290);
  std::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_true>
            (__return_storage_ptr__,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&exit_node.field_2 + 8),
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_270
            );
  std::__cxx11::wstring::~wstring((wstring *)local_270);
  std::__cxx11::wstring::~wstring((wstring *)((long)&exit_node.field_2 + 8));
  std::
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
             *)&i);
  std::__cxx11::wstring::~wstring((wstring *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::wstring, std::wstring> print_atn(std::wostream& os, int index, const Identifier& key)
	{
		std::wstring prefix = key + std::to_wstring(m_counter++);

		os << L"subgraph cluster_" << prefix << L" {" << std::endl;

		const ATNMachine<TCHAR>& atn = m_networks.at(key);

		std::vector<std::pair<std::wstring, std::wstring> > entry_exit_nodes(atn.m_nodes.size());

		for (unsigned int i = 0; i < atn.m_nodes.size(); i++)
		{
			const ATNNode<TCHAR>& node = atn.m_nodes[i];
			std::wstring node_name = prefix + L"_N" + std::to_wstring(i);

			if (node.is_nonterminal())
			{
				if (m_stack.size() < (size_t)m_maxdepth && std::find(m_stack.begin(), m_stack.end(), node.m_invoke) == m_stack.end())
				{
					m_stack.push_back(node.m_invoke);
					entry_exit_nodes[i] = print_atn(os, i, node.m_invoke);
					m_stack.pop_back();
				}
				else
				{
					entry_exit_nodes[i] = node.get_entry_exit_wide(node_name);
					node.print(os, i, node_name);
				}
			}
			else
			{
				entry_exit_nodes[i] = node.get_entry_exit_wide(node_name);
				node.print(os, i, node_name);
			}
		}

		for (unsigned int i = 0; i < atn.m_nodes.size(); i++)
		{
			const ATNNode<TCHAR>& node = atn.m_nodes[i];
			const std::wstring& exit = entry_exit_nodes[i].second;
			for (const auto& t : node.m_transitions)
			{
				const std::wstring& entry = entry_exit_nodes[t.dest()].first;

				os << exit << L" -> " << entry << L" [ label=\"";
				os << t;
				os << L"\" ];" << std::endl;
			}
		}

		os << L"label = \"[" << index << L"]" << key << L"\";" << std::endl;
		os << L"}" << std::endl;

		std::wstring entry_node = prefix + L"_N0";
		std::wstring exit_node = prefix + L"_N" + std::to_wstring(atn.m_nodes.size() - 1);

		return std::pair<std::wstring, std::wstring>(entry_node, exit_node);
	}